

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.c
# Opt level: O0

uint8_t player_hp_attr(player *p)

{
  uint8_t local_11;
  uint8_t attr;
  player *p_local;
  
  if (p->chp < p->mhp) {
    if ((int)((int)p->mhp * (uint)(p->opts).hitpoint_warn) / 10 < (int)p->chp) {
      local_11 = '\v';
    }
    else {
      local_11 = '\x04';
    }
  }
  else {
    local_11 = '\r';
  }
  return local_11;
}

Assistant:

uint8_t player_hp_attr(struct player *p)
{
	uint8_t attr;
	
	if (p->chp >= p->mhp)
		attr = COLOUR_L_GREEN;
	else if (p->chp > (p->mhp * p->opts.hitpoint_warn) / 10)
		attr = COLOUR_YELLOW;
	else
		attr = COLOUR_RED;
	
	return attr;
}